

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

int Abc_CubeContain(char *pCube1,char *pCube2,int nVars)

{
  int local_30;
  uint local_2c;
  int fCont21;
  int fCont12;
  int v;
  int nVars_local;
  char *pCube2_local;
  char *pCube1_local;
  
  local_2c = 1;
  local_30 = 1;
  fCont21 = 0;
  do {
    if (nVars <= fCont21) {
      if ((local_30 == 0) && (local_2c == 0)) {
        __assert_fail("fCont21 || fCont12",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanOrder.c"
                      ,0x22c,"int Abc_CubeContain(char *, char *, int)");
      }
      return local_30 << 1 | local_2c;
    }
    if (pCube1[fCont21] != pCube2[fCont21]) {
      if (pCube1[fCont21] == '-') {
        local_30 = 0;
      }
      else {
        if (pCube2[fCont21] != '-') {
          return 0;
        }
        local_2c = 0;
      }
      if ((local_2c == 0) && (local_30 == 0)) {
        return 0;
      }
    }
    fCont21 = fCont21 + 1;
  } while( true );
}

Assistant:

static inline int Abc_CubeContain( char * pCube1, char * pCube2, int nVars )
{
    int v, fCont12 = 1, fCont21 = 1;
    for ( v = 0; v < nVars; v++ )
    {
        if ( pCube1[v] == pCube2[v] )
            continue;
        if ( pCube1[v] == '-' )
            fCont21 = 0;
        else if ( pCube2[v] == '-' )
            fCont12 = 0;
        else
            return 0;
        if ( !fCont12 && !fCont21 )
            return 0;
    }
    assert( fCont21 || fCont12 );
    return (fCont21 << 1) | fCont12;
}